

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::utp_socket_impl::should_delete(utp_socket_impl *this)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)&this->field_0x21c;
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 0x8c) == 0) {
LAB_0039b66a:
      return (uVar1 >> 0xe & 1) == 0;
    }
  }
  else if (-1 < (char)uVar1) goto LAB_0039b66a;
  return false;
}

Assistant:

bool utp_socket_impl::should_delete() const
{
	INVARIANT_CHECK;

	// if the socket state is not attached anymore we're free
	// to delete it from the client's point of view. The other
	// endpoint however might still need to be told that we're
	// closing the socket. Only delete the state if we're not
	// attached and we're in a state where the other end doesn't
	// expect the socket to still be alive
	// when m_stalled is true, it means the socket manager has a
	// pointer to this socket, waiting for the UDP socket to
	// become writable again. We have to wait for that, so that
	// the pointer is removed from that queue. Otherwise we would
	// leave a dangling pointer in the socket manager
	bool ret = (m_state >= static_cast<std::uint8_t>(state_t::error_wait) || state() == state_t::none)
		&& !m_attached && !m_stalled;

	if (ret)
	{
		UTP_LOGV("%8p: should_delete() = true\n", static_cast<void const*>(this));
	}

	return ret;
}